

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

bool __thiscall
mprpc::MpRpcServer::send_error_rsp
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,
          shared_ptr<mprpc::MpRpcMessage> *req,int error,string *err_msg)

{
  uint uVar1;
  undefined2 uVar2;
  char *pcVar3;
  long lVar4;
  ssize_t sVar5;
  uint16_t val_2;
  MsgPackPacker *this_00;
  int __flags;
  uint16_t val;
  ushort uVar6;
  uchar d;
  MsgPackPacker pk;
  char local_71;
  uint local_70;
  uint local_6c;
  MsgPackPacker local_68;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  __flags = (int)err_msg;
  local_68.pk.data = &local_68;
  local_68.sb.size = 0;
  local_68.sb.data = (char *)0x0;
  local_68.sb.alloc = 0;
  local_68.pk.callback = msgpack_sbuffer_write;
  pcVar3 = (char *)realloc((void *)0x0,0x2000);
  if (pcVar3 != (char *)0x0) {
    pcVar3[local_68.sb.size] = -0x7c;
    local_68.sb.size = local_68.sb.size + 1;
    local_68.sb.data = pcVar3;
    local_68.sb.alloc = 0x2000;
  }
  uVar1 = ((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->id;
  local_71 = -0x5e;
  (*local_68.pk.callback)(local_68.pk.data,&local_71,1);
  (*local_68.pk.callback)(local_68.pk.data,"id",2);
  uVar6 = (ushort)uVar1;
  uVar2 = local_70._2_2_;
  local_6c._0_1_ = (undefined1)uVar1;
  local_6c = uVar1;
  if ((int)uVar1 < -0x20) {
    if ((int)uVar1 < -0x8000) {
      local_71 = -0x2e;
      local_70 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      (*local_68.pk.callback)(local_68.pk.data,&local_71,5);
    }
    else if ((int)uVar1 < -0x80) {
      local_71 = -0x2f;
      local_70 = CONCAT22(uVar2,uVar6 << 8 | uVar6 >> 8);
      (*local_68.pk.callback)(local_68.pk.data,&local_71,3);
    }
    else {
      local_71 = -0x30;
      local_70 = CONCAT31(local_70._1_3_,(undefined1)local_6c);
      (*local_68.pk.callback)(local_68.pk.data,&local_71,2);
    }
  }
  else if ((int)uVar1 < 0x80) {
    (*local_68.pk.callback)(local_68.pk.data,(char *)&local_6c,1);
  }
  else if ((int)uVar1 < 0x100) {
    local_71 = -0x34;
    local_70 = CONCAT31(local_70._1_3_,(undefined1)local_6c);
    (*local_68.pk.callback)(local_68.pk.data,&local_71,2);
  }
  else if ((int)uVar1 < 0x10000) {
    local_71 = -0x33;
    local_70 = CONCAT22(uVar2,uVar6 << 8 | uVar6 >> 8);
    (*local_68.pk.callback)(local_68.pk.data,&local_71,3);
  }
  else {
    local_71 = -0x32;
    local_70 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    (*local_68.pk.callback)(local_68.pk.data,&local_71,5);
  }
  MsgPackPacker::pack_map_item
            (&local_68,"method",
             &((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              method);
  local_71 = -0x5b;
  (*local_68.pk.callback)(local_68.pk.data,&local_71,1);
  (*local_68.pk.callback)(local_68.pk.data,"error",5);
  local_71 = -0x7e;
  (*local_68.pk.callback)(local_68.pk.data,&local_71,1);
  local_71 = -0x5c;
  (*local_68.pk.callback)(local_68.pk.data,&local_71,1);
  (*local_68.pk.callback)(local_68.pk.data,"code",4);
  uVar6 = (ushort)error;
  uVar2 = local_70._2_2_;
  local_6c._0_1_ = (undefined1)error;
  local_6c = error;
  if (error < -0x20) {
    if (error < -0x8000) {
      local_71 = -0x2e;
      local_70 = (uint)error >> 0x18 | (error & 0xff0000U) >> 8 | (error & 0xff00U) << 8 |
                 error << 0x18;
      (*local_68.pk.callback)(local_68.pk.data,&local_71,5);
    }
    else if (error < -0x80) {
      local_71 = -0x2f;
      local_70 = CONCAT22(uVar2,uVar6 << 8 | uVar6 >> 8);
      (*local_68.pk.callback)(local_68.pk.data,&local_71,3);
    }
    else {
      local_71 = -0x30;
      local_70 = CONCAT31(local_70._1_3_,(undefined1)local_6c);
      (*local_68.pk.callback)(local_68.pk.data,&local_71,2);
    }
  }
  else if (error < 0x80) {
    (*local_68.pk.callback)(local_68.pk.data,(char *)&local_6c,1);
  }
  else if (error < 0x100) {
    local_71 = -0x34;
    local_70 = CONCAT31(local_70._1_3_,(undefined1)local_6c);
    (*local_68.pk.callback)(local_68.pk.data,&local_71,2);
  }
  else if (error < 0x10000) {
    local_71 = -0x33;
    local_70 = CONCAT22(uVar2,uVar6 << 8 | uVar6 >> 8);
    (*local_68.pk.callback)(local_68.pk.data,&local_71,3);
  }
  else {
    local_71 = -0x32;
    local_70 = (uint)error >> 0x18 | (error & 0xff0000U) >> 8 | (error & 0xff00U) << 8 |
               error << 0x18;
    (*local_68.pk.callback)(local_68.pk.data,&local_71,5);
  }
  MsgPackPacker::pack_map_item(&local_68,"message",err_msg);
  local_71 = -0x5b;
  (*local_68.pk.callback)(local_68.pk.data,&local_71,1);
  (*local_68.pk.callback)(local_68.pk.data,"debug",5);
  local_71 = -0x7e;
  (*local_68.pk.callback)(local_68.pk.data,&local_71,1);
  MsgPackPacker::pack_map_item
            (&local_68,"recv_time",
             (((req->super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             recv_time).__d.__r / 1000);
  lVar4 = std::chrono::_V2::system_clock::now();
  this_00 = &local_68;
  MsgPackPacker::pack_map_item(this_00,"send_time",lVar4 / 1000);
  local_38 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30 = (conn->super___shared_ptr<mprpc::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  sVar5 = send((MpRpcServer *)this_00,(int)&local_38,local_68.sb.data,local_68.sb.size,__flags);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  free(local_68.sb.data);
  return (bool)(char)sVar5;
}

Assistant:

bool MpRpcServer::send_error_rsp(shared_ptr<mprpc::ClientConnection> conn,
                                    shared_ptr<mprpc::MpRpcMessage> req,
                                    int error,
                                    const string& err_msg)
    {
        MsgPackPacker pk;
        pk.pack_map(4);

        pk.pack_map_item("id", req->id);
        pk.pack_map_item("method", req->method);

        pk.pack_string("error");
        pk.pack_map(2);
        pk.pack_map_item("code", error);
        pk.pack_map_item("message", err_msg);

        pk.pack_string("debug");
        pk.pack_map(2);
        pk.pack_map_item("recv_time", (uint64_t)time_point_cast<microseconds>(req->recv_time).time_since_epoch().count());
        pk.pack_map_item("send_time", (uint64_t)time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count());

        return send(conn, pk.sb.data, pk.sb.size);
    }